

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O3

void server::invadmin_cmd(int cid,char **args,int argc)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  clientinfo *ci;
  char *pcVar4;
  
  bVar2 = QServ::getlastSA(&qs);
  if (!bVar2) {
    return;
  }
  iVar3 = QServ::getSender(&qs);
  ci = QServ::getClient(&qs,iVar3);
  pcVar1 = invadminpass;
  pcVar4 = args[1];
  iVar3 = strcmp(invadminpass,pcVar4);
  if ((pcVar1 != pcVar4) && (iVar3 != 0)) {
    sendf(ci->clientnum,1,"ris",0x23,"\f3Error: Incorrect admin password");
    return;
  }
  ci->privilege = 3;
  ci->isInvAdmin = true;
  sendf(ci->clientnum,1,"ris",0x23,"Invisible \f6admin \f7activated");
  pcVar4 = colorname(ci);
  out(1,"%s became an invisible admin",pcVar4);
  pcVar4 = colorname(ci);
  out(2,"%s became an invisible admin",pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK invadmin_cmd(p) {
        if(CMD_SA) {
            clientinfo *ci = qs.getClient(CMD_SENDER);
            if(!strcmp(invadminpass, args[1]) || invadminpass == args[1]) {
                ci->privilege = PRIV_ADMIN;
                ci->isInvAdmin = true;
                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "Invisible \f6admin \f7activated");
                out(ECHO_IRC, "%s became an invisible admin", colorname(ci));
                out(ECHO_CONSOLE, "%s became an invisible admin", colorname(ci));
            }
            else sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Incorrect admin password");
        }
    }